

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

int QUtil::call_main_from_wmain
              (int argc,wchar_t **argv,function<int_(int,_const_char_*const_*)> *realmain)

{
  function<int_(int,_char_**)> *realmain_00;
  int iVar1;
  _Any_data local_58;
  function<int_(int,_char_**)> *local_48;
  undefined8 uStack_40;
  wchar_t *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  std::function<int_(int,_const_char_*const_*)>::function
            ((function<int_(int,_const_char_*const_*)> *)&local_58,realmain);
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38 = (wchar_t *)0x0;
  uStack_30 = 0;
  local_38 = (wchar_t *)operator_new(0x20);
  realmain_00 = local_48;
  local_38[0] = L'\0';
  local_38[1] = L'\0';
  local_38[2] = L'\0';
  local_38[3] = L'\0';
  local_38[4] = L'\0';
  local_38[5] = L'\0';
  *(undefined8 *)(local_38 + 6) = uStack_40;
  if (local_48 != (function<int_(int,_char_**)> *)0x0) {
    *(void **)local_38 = local_58._M_unused._M_object;
    *(undefined8 *)(local_38 + 2) = local_58._8_8_;
    *(function<int_(int,_char_**)> **)(local_38 + 4) = local_48;
    local_48 = (function<int_(int,_char_**)> *)0x0;
    uStack_40 = 0;
  }
  pcStack_20 = std::
               _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QUtil.cc:1937:53)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QUtil.cc:1937:53)>
             ::_M_manager;
  iVar1 = ::call_main_from_wmain(SUB41(argc,0),(int)argv,&local_38,realmain_00);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_48 != (function<int_(int,_char_**)> *)0x0) {
    (*(code *)local_48)(&local_58,&local_58,3);
  }
  return iVar1;
}

Assistant:

int
QUtil::call_main_from_wmain(
    int argc, wchar_t const* const argv[], std::function<int(int, char const* const[])> realmain)
{
    return ::call_main_from_wmain(true, argc, argv, [realmain](int new_argc, char* new_argv[]) {
        return realmain(new_argc, new_argv);
    });
}